

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Leaf::loadChildren
          (Leaf *this,LDIterator *children)

{
  bool bVar1;
  SelectedSummand *in_RSI;
  long *in_RDI;
  SelectedSummand *s;
  SelectedSummand local_70;
  undefined1 local_40 [64];
  
  while( true ) {
    bVar1 = Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::hasNext
                      ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)0x3e3643);
    if (!bVar1) break;
    Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::next
              ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)0x3e3656);
    s = &local_70;
    Kernel::SelectedSummand::SelectedSummand(in_RSI,s);
    Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs((Lhs *)in_RSI,s);
    (**(code **)(*in_RDI + 0x48))(in_RDI,local_40);
    Inferences::ALASCA::FourierMotzkinConf::Lhs::~Lhs((Lhs *)0x3e3696);
    Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x3e36a0);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::Leaf::loadChildren(LDIterator children)
{
  while(children.hasNext()) {
    // TODO move instead of copying here
    insert(*children.next());
  }
}